

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  int iVar1;
  Nullable<const_char_*> failure_msg;
  int iVar2;
  LogMessageFatal local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    this->last_returned_size_ = 0;
    iVar1 = this->size_ - this->position_;
    iVar2 = this->position_ + count;
    if (iVar1 < count) {
      iVar2 = this->size_;
    }
    this->position_ = iVar2;
    return count <= iVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x50,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  ABSL_CHECK_GE(count, 0);
  last_returned_size_ = 0;  // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}